

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_build_child_array(void)

{
  byte bVar1;
  bson_t *b_00;
  undefined8 uVar2;
  bson_t *child2;
  bson_t *b2;
  bson_t child;
  bson_t b;
  undefined1 local_200 [128];
  bson_t local_180 [2];
  
  bson_init(local_180);
  bVar1 = bson_append_array_begin(local_180,"foo",0xffffffff,local_200);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5a5,"test_bson_build_child_array","bson_append_array_begin (&b, \"foo\", -1, &child)")
    ;
    abort();
  }
  bVar1 = bson_append_utf8(local_200,"0",0xffffffff,"baz");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5a6,"test_bson_build_child_array","bson_append_utf8 (&child, \"0\", -1, \"baz\", -1)")
    ;
    abort();
  }
  bVar1 = bson_append_array_end(local_180,local_200);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5a7,"test_bson_build_child_array","bson_append_array_end (&b, &child)");
    abort();
  }
  b_00 = (bson_t *)bson_new();
  uVar2 = bson_new();
  bVar1 = bson_append_utf8(uVar2,"0",0xffffffff,"baz");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5ab,"test_bson_build_child_array","bson_append_utf8 (child2, \"0\", -1, \"baz\", -1)")
    ;
    abort();
  }
  bVar1 = bson_append_array(b_00,"foo",0xffffffff,uVar2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5ac,"test_bson_build_child_array","bson_append_array (b2, \"foo\", -1, child2)");
    abort();
  }
  bson_destroy(uVar2);
  if (local_180[0].len != b_00->len) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0x5af,"test_bson_build_child_array","b.len == b2->len");
    abort();
  }
  BSON_ASSERT_BSON_EQUAL(local_180,b_00);
  bson_destroy(local_180);
  bson_destroy(b_00);
  return;
}

Assistant:

static void
test_bson_build_child_array (void)
{
   bson_t b;
   bson_t child;
   bson_t *b2;
   bson_t *child2;

   bson_init (&b);
   BSON_ASSERT (bson_append_array_begin (&b, "foo", -1, &child));
   BSON_ASSERT (bson_append_utf8 (&child, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array_end (&b, &child));

   b2 = bson_new ();
   child2 = bson_new ();
   BSON_ASSERT (bson_append_utf8 (child2, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array (b2, "foo", -1, child2));
   bson_destroy (child2);

   BSON_ASSERT (b.len == b2->len);
   BSON_ASSERT_BSON_EQUAL (&b, b2);

   bson_destroy (&b);
   bson_destroy (b2);
}